

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O0

REF_STATUS ref_migrate_inspect(REF_MIGRATE ref_migrate)

{
  REF_NODE pRVar1;
  REF_INT local_4c;
  REF_INT local_48;
  int local_44;
  REF_GLOB local_40;
  REF_GLOB global;
  REF_INT part;
  REF_INT local;
  REF_INT item;
  REF_INT node;
  REF_NODE ref_node;
  REF_MIGRATE ref_migrate_local;
  
  pRVar1 = ref_migrate->grid->node;
  for (local = 0; local < ref_migrate->max; local = local + 1) {
    if (ref_migrate->global[local] != -1) {
      if (((local < 0) || (pRVar1->max <= local)) || (pRVar1->global[local] < 0)) {
        local_40 = -1;
      }
      else {
        local_40 = pRVar1->global[local];
      }
      printf(" %2d : %ld :",(ulong)(uint)pRVar1->ref_mpi->id,local_40);
      if ((local < 0) || (ref_migrate->parent_local->nnode <= local)) {
        local_44 = -1;
      }
      else {
        local_44 = ref_migrate->parent_local->first[local];
      }
      part = local_44;
      if (local_44 == -1) {
        local_48 = -1;
      }
      else {
        local_48 = ref_migrate->parent_local->item[local_44].ref;
      }
      global._4_4_ = local_48;
      while (part != -1) {
        printf(" %ld+%d",ref_migrate->global[global._4_4_],
               (ulong)(uint)ref_migrate->parent_part->item[part].ref);
        part = ref_migrate->parent_local->item[part].next;
        if (part == -1) {
          local_4c = -1;
        }
        else {
          local_4c = ref_migrate->parent_local->item[part].ref;
        }
        global._4_4_ = local_4c;
      }
      printf("\n");
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_inspect(REF_MIGRATE ref_migrate) {
  REF_NODE ref_node = ref_grid_node(ref_migrate_grid(ref_migrate));
  REF_INT node, item, local, part;
  REF_GLOB global;

  each_ref_migrate_node(ref_migrate, node) {
    printf(" %2d : " REF_GLOB_FMT " :", ref_mpi_rank(ref_node_mpi(ref_node)),
           ref_node_global(ref_node, node));
    each_ref_adj_node_item_with_ref(ref_migrate_parent_local(ref_migrate), node,
                                    item, local) {
      global = ref_migrate_global(ref_migrate, local);
      part = ref_adj_item_ref(ref_migrate_parent_part(ref_migrate), item);
      printf(" " REF_GLOB_FMT "+%d", global, part);
    }
    printf("\n");
  }
  return REF_SUCCESS;
}